

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::FileInputStream::tryRead(FileInputStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  unsigned_long local_18;
  
  local_18 = (**(code **)(**(long **)((long)buffer + 8) + 0x30))
                       (*(long **)((long)buffer + 8),*(undefined8 *)((long)buffer + 0x10));
  *(long *)((long)buffer + 0x10) = *(long *)((long)buffer + 0x10) + local_18;
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
            ((PromiseDisposer *)this,&local_18);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> FileInputStream::tryRead(void* buffer, size_t minBytes, size_t maxBytes) {
  // Note that our contract with `minBytes` is that we should only return fewer than `minBytes` on
  // EOF. A file read will only produce fewer than the requested number of bytes if EOF was reached.
  // `minBytes` cannot be greater than `maxBytes`. So, this read satisfies the `minBytes`
  // requirement.
  size_t result = file.read(offset, arrayPtr(reinterpret_cast<byte*>(buffer), maxBytes));
  offset += result;
  return result;
}